

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp_stress.c
# Opt level: O1

void setup_fiber(Fiber *caller,Fiber *fiber,Args **args,int id)

{
  Args *pAVar1;
  
  fiber_alloc(fiber,0x4000,guard,(void *)0x0,8);
  fiber_reserve_return(fiber,entry,args,8);
  (*args)->self = fiber;
  (*args)->caller = caller;
  pAVar1 = *args;
  pAVar1->n = 0x100;
  pAVar1->id = id;
  pAVar1->done = false;
  return;
}

Assistant:

static void
setup_fiber(Fiber *caller, Fiber *fiber, Args **args, int id)
{
    (void) fiber_alloc(fiber, 16 * 1024, guard, NULL, FIBER_FLAG_GUARD_LO);
    fiber_reserve_return(fiber, entry, (void **) args, sizeof *args);
    (*args)->self = fiber;
    (*args)->caller = caller;
    (*args)->n = 256;
    (*args)->id = id;
    (*args)->done = false;
}